

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O1

int AF_A_FreezeDeathChunks(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  player_t *ppVar4;
  PClass *pPVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined8 uVar11;
  PClassActor *pPVar12;
  AActor *pAVar13;
  APlayerPawn *this;
  undefined4 extraout_var_00;
  PClass *pPVar14;
  FState *pFVar15;
  FString *this_00;
  VMValue *pVVar16;
  char *__assertion;
  AActor *ent;
  long lVar17;
  bool bVar18;
  VMValue params [3];
  DVector2 v;
  anon_union_16_5_cf148060_for_VMValue_0 local_a8;
  AActor *local_98;
  undefined4 local_90;
  undefined1 local_8c;
  FString local_88;
  undefined4 local_80;
  char local_7c [12];
  AActor *local_70;
  VMFrameStack *local_68;
  double local_60;
  double local_58;
  double local_50;
  FName local_48;
  undefined4 uStack_44;
  double dStack_40;
  FName local_38;
  FSoundID local_34;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  local_68 = stack;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005db5a5;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    ent = *(AActor **)&param->field_0;
    pVVar16 = param;
    uVar10 = numparam;
    if (ent != (AActor *)0x0) {
      if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
        (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
      }
      pPVar14 = (ent->super_DThinker).super_DObject.Class;
      bVar18 = pPVar14 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar18;
      uVar10 = (uint)bVar18;
      pVVar16 = (VMValue *)(ulong)(pPVar14 == pPVar5 || bVar18);
      if (pPVar14 != pPVar5 && !bVar18) {
        do {
          pPVar14 = pPVar14->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar14 != (PClass *)0x0);
          if (pPVar14 == pPVar5) break;
        } while (pPVar14 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005db5a5;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005db57a;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar11 = (**(code **)*puVar3)(puVar3,pVVar16,uVar10,ret);
          puVar3[1] = uVar11;
        }
        pPVar14 = (PClass *)puVar3[1];
        bVar18 = pPVar14 != (PClass *)0x0;
        if (pPVar14 != pPVar5 && bVar18) {
          do {
            pPVar14 = pPVar14->ParentClass;
            bVar18 = pPVar14 != (PClass *)0x0;
            if (pPVar14 == pPVar5) break;
          } while (pPVar14 != (PClass *)0x0);
        }
        if (!bVar18) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005db5a5;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      dVar1 = (ent->Vel).X;
      if (((dVar1 == 0.0) &&
          ((((!NAN(dVar1) && (dVar1 = (ent->Vel).Y, dVar1 == 0.0)) && (!NAN(dVar1))) &&
           ((dVar1 = (ent->Vel).Z, dVar1 == 0.0 && (!NAN(dVar1))))))) ||
         (((ent->flags6).Value & 0x20000) != 0)) {
        (ent->Vel).X = 0.0;
        (ent->Vel).Y = 0.0;
        (ent->Vel).Z = 0.0;
        local_34.ID = S_FindSound("misc/icebreak");
        S_Sound(ent,4,&local_34,1.0,1.0);
        iVar7 = (int)(ent->radius * ent->Height);
        iVar6 = iVar7 + 0x1f;
        if (-1 < iVar7) {
          iVar6 = iVar7;
        }
        uVar10 = iVar6 >> 5;
        if (iVar6 >> 5 < 5) {
          uVar10 = 4;
        }
        uVar8 = FRandom::GenRand32(&pr_freeze);
        uVar9 = FRandom::GenRand32(&pr_freeze);
        iVar7 = (int)((uVar8 & 0xff) - (uVar9 & 0xff)) % (int)(uVar10 >> 2) + uVar10;
        iVar6 = 0x18;
        local_70 = ent;
        if (0x18 < iVar7) {
          iVar6 = iVar7;
        }
        do {
          uVar10 = FRandom::GenRand32(&pr_freeze);
          local_50 = (double)(int)((uVar10 & 0xff) - 0x80) * ent->radius * 0.0078125;
          uVar10 = FRandom::GenRand32(&pr_freeze);
          local_58 = (double)(int)((uVar10 & 0xff) - 0x80) * ent->radius * 0.0078125;
          uVar10 = FRandom::GenRand32(&pr_freeze);
          local_60 = ((double)(uVar10 & 0xff) * ent->Height) / 255.0;
          iVar7 = FName::NameManager::FindName(&FName::NameData,"IceChunk",false);
          P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,local_50,local_58);
          local_98 = (AActor *)(local_60 + (ent->__Pos).Z);
          local_a8.field_1.a = (void *)CONCAT44(uStack_44,local_48.Index);
          local_a8._8_8_ = dStack_40;
          local_48.Index = iVar7;
          pPVar12 = ClassForSpawn(&local_48);
          pAVar13 = AActor::StaticSpawn(pPVar12,(DVector3 *)&local_a8.field_1,ALLOW_REPLACE,false);
          if (pAVar13 != (AActor *)0x0) {
            pFVar15 = pAVar13->SpawnState;
            uVar10 = FRandom::GenRand32(&pr_freeze);
            AActor::SetState(pAVar13,pFVar15 + (uVar10 & 0xff) % 3,false);
            uVar10 = FRandom::GenRand32(&pr_freeze);
            uVar8 = FRandom::GenRand32(&pr_freeze);
            (pAVar13->Vel).X = (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125;
            uVar10 = FRandom::GenRand32(&pr_freeze);
            ent = local_70;
            uVar8 = FRandom::GenRand32(&pr_freeze);
            (pAVar13->Vel).Y = (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125;
            (pAVar13->Vel).Z = (((pAVar13->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
            local_a8._8_5_ = 0x300000001;
            local_90 = 1;
            local_8c = 3;
            local_88.Chars = (char *)0x0;
            local_80 = 8;
            local_7c[0] = 3;
            local_a8.field_1.a = pAVar13;
            local_98 = pAVar13;
            VMFrameStack::Call(local_68,&A_IceSetTics_VMPtr->super_VMFunction,
                               (VMValue *)&local_a8.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0)
            ;
            lVar17 = -0x30;
            this_00 = &local_88;
            do {
              if (*(char *)((long)&this_00[1].Chars + 4) == '\x02') {
                FString::~FString(this_00);
              }
              this_00 = this_00 + -2;
              lVar17 = lVar17 + 0x10;
            } while (lVar17 != 0);
            pAVar13->RenderStyle = ent->RenderStyle;
            pAVar13->Alpha = ent->Alpha;
          }
          bVar18 = 0 < iVar6;
          iVar6 = iVar6 + -1;
        } while (bVar18);
        if (ent->player != (player_t *)0x0) {
          local_48.Index = FName::NameManager::FindName(&FName::NameData,"IceChunkHead",false);
          local_a8.field_1.a = (void *)(ent->__Pos).X;
          local_a8._8_8_ = (ent->__Pos).Y;
          local_98 = (AActor *)(ent->player->mo->ViewHeight + (ent->__Pos).Z);
          pPVar12 = ClassForSpawn(&local_48);
          this = (APlayerPawn *)
                 AActor::StaticSpawn(pPVar12,(DVector3 *)&local_a8.field_1,ALLOW_REPLACE,false);
          if (this != (APlayerPawn *)0x0) {
            uVar10 = FRandom::GenRand32(&pr_freeze);
            uVar8 = FRandom::GenRand32(&pr_freeze);
            ((DVector3 *)(&(this->super_AActor).super_DThinker + 3))->X =
                 (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125;
            uVar10 = FRandom::GenRand32(&pr_freeze);
            uVar8 = FRandom::GenRand32(&pr_freeze);
            ((DVector3 *)(&(this->super_AActor).super_DThinker + 3))->Y =
                 (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125;
            ((DVector3 *)(&(this->super_AActor).super_DThinker + 3))->Z =
                 (((pAVar13->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
            *(int *)((long)(&(this->super_AActor).super_DThinker + 8) + 0xc) = ent->health;
            *(double *)((long)(&(this->super_AActor).super_DThinker + 2) + 0x20) =
                 (ent->Angles).Yaw.Degrees;
            pPVar5 = APlayerPawn::RegistrationInfo.MyClass;
            if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
              iVar6 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
              (this->super_AActor).super_DThinker.super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_00,iVar6);
            }
            pPVar14 = (this->super_AActor).super_DThinker.super_DObject.Class;
            bVar18 = pPVar14 != (PClass *)0x0;
            if (pPVar14 != pPVar5 && bVar18) {
              do {
                pPVar14 = pPVar14->ParentClass;
                bVar18 = pPVar14 != (PClass *)0x0;
                if (pPVar14 == pPVar5) break;
              } while (pPVar14 != (PClass *)0x0);
            }
            if (bVar18) {
              ppVar4 = ent->player;
              *(player_t **)((long)(&(this->super_AActor).super_DThinker + 9) + 8) = ppVar4;
              ppVar4->mo = this;
              ent->player = (player_t *)0x0;
              AActor::ObtainInventory((AActor *)this,ent);
            }
            (this->super_AActor).Angles.Pitch.Degrees = 0.0;
            (this->super_AActor).RenderStyle = ent->RenderStyle;
            (this->super_AActor).Alpha = ent->Alpha;
            ppVar4 = (this->super_AActor).player;
            pAVar13 = (ppVar4->camera).field_0.p;
            if ((pAVar13 != (AActor *)0x0) &&
               (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (ppVar4->camera).field_0.p = (AActor *)0x0;
              pAVar13 = (AActor *)0x0;
            }
            if (pAVar13 == ent) {
              (((this->super_AActor).player)->camera).field_0.p = (AActor *)this;
            }
          }
        }
        if (((ent->flags4).Value & 8) != 0) {
          A_BossDeath(ent);
        }
        A_Unblock(ent,true);
        local_38.Index = 1;
        pFVar15 = AActor::FindState(ent,&local_38);
        AActor::SetState(ent,pFVar15,false);
      }
      else {
        ent->tics = 0x69;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005db57a:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005db5a5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0x10f,"int AF_A_FreezeDeathChunks(VMFrameStack *, VMValue *, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeathChunks)
{
	PARAM_ACTION_PROLOGUE;

	int i;
	int numChunks;
	AActor *mo;
	
	if (!self->Vel.isZero() && !(self->flags6 & MF6_SHATTERING))
	{
		self->tics = 3*TICRATE;
		return 0;
	}
	self->Vel.Zero();
	S_Sound (self, CHAN_BODY, "misc/icebreak", 1, ATTN_NORM);

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An actor with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int>(4, int(self->radius * self->Height)/32);
	i = (pr_freeze.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_freeze() - 128)*self->radius / 128;
		double yo = (pr_freeze() - 128)*self->radius / 128;
		double zo = (pr_freeze()*self->Height / 255);

		mo = Spawn("IceChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + (pr_freeze()%3));
			mo->Vel.X = pr_freeze.Random2() / 128.;
			mo->Vel.Y = pr_freeze.Random2() / 128.;
			mo->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;
			CALL_ACTION(A_IceSetTics, mo); // set a random tic wait
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
		}
	}
	if (self->player)
	{ // attach the player's view to a chunk of ice
		AActor *head = Spawn("IceChunkHead", self->PosPlusZ(self->player->mo->ViewHeight), ALLOW_REPLACE);
		if (head != NULL)
		{
			head->Vel.X = pr_freeze.Random2() / 128.;
			head->Vel.Y = pr_freeze.Random2() / 128.;
			head->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;

			head->health = self->health;
			head->Angles.Yaw = self->Angles.Yaw;
			if (head->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				head->player = self->player;
				head->player->mo = static_cast<APlayerPawn*>(head);
				self->player = NULL;
				head->ObtainInventory (self);
			}
			head->Angles.Pitch = 0.;
			head->RenderStyle = self->RenderStyle;
			head->Alpha = self->Alpha;
			if (head->player->camera == self)
			{
				head->player->camera = head;
			}
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->SetState(self->FindState(NAME_Null));
	return 0;
}